

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

uint8_t cueify_full_toc_get_session_sub_q_channel_format
                  (cueify_full_toc *t,uint8_t session,uint8_t point)

{
  cueify_full_toc_private *toc;
  uint8_t point_local;
  uint8_t session_local;
  cueify_full_toc *t_local;
  
  if (t == (cueify_full_toc *)0x0) {
    t_local._7_1_ = '\0';
  }
  else if ((session < *(byte *)t) || (*(byte *)((long)t + 1) < session)) {
    t_local._7_1_ = '\0';
  }
  else if (point == 0xa0) {
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x398);
  }
  else if (point == 0xa1) {
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x3a1);
  }
  else if (point == 0xaa) {
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x38f);
  }
  else {
    t_local._7_1_ = '\0';
  }
  return t_local._7_1_;
}

Assistant:

uint8_t cueify_full_toc_get_session_sub_q_channel_format(cueify_full_toc *t,
							 uint8_t session,
							 uint8_t point) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	switch (point) {
	case CUEIFY_FULL_TOC_FIRST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[1].adr;
	case CUEIFY_FULL_TOC_LAST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[2].adr;
	case CUEIFY_LEAD_OUT_TRACK:
	    return toc->sessions[session].pseudotracks[0].adr;
	default:
	    return 0;
	}
    } else {
	return 0;
    }
}